

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation_algorithm.cpp
# Opt level: O2

Score __thiscall
indigox::algorithm::ElectronOptimisationAlgorithm::CalculateVertexEnergy
          (ElectronOptimisationAlgorithm *this,ElnVertex *vert)

{
  ElnVertex pvVar1;
  long lVar2;
  ElectronOpt *pEVar3;
  uint uVar4;
  ElnVertex pvVar5;
  ElnVertex pvVar6;
  _Rb_tree_node_base *p_Var7;
  difference_type dVar8;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Var9;
  Score *pSVar10;
  uint uVar11;
  byte bVar12;
  key_type_conflict1 *__k;
  byte bVar13;
  StoredVertex *sv;
  MolVertPair id_00;
  MolVertPair id_01;
  MolVertPair id;
  uint local_64;
  ElectronOpt *local_60;
  ElnVertex *local_58;
  key_type_conflict1 local_4c;
  void *local_48;
  void *pvStack_40;
  
  pvVar1 = *vert;
  local_48 = *(void **)((long)pvVar1 + 0x30);
  pvStack_40 = *(void **)((long)pvVar1 + 0x38);
  local_60 = (ElectronOpt *)
             std::
             __count_if<__gnu_cxx::__normal_iterator<std::pair<void*,void*>*,std::vector<std::pair<void*,void*>,std::allocator<std::pair<void*,void*>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::pair<void*,void*>const>>
                       ((this->parent_->possibleLocations_).
                        super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (this->parent_->possibleLocations_).
                        super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,(pair<void_*,_void_*> *)&local_48
                       );
  if (local_48 == pvStack_40) {
    if ((((Options::AssignElectrons::ALLOW_CHARGED_CARBON != false) ||
         (*(char *)((long)pvVar1 + 0x45) != '\x06')) || (*(char *)((long)pvVar1 + 0x4a) == '\0')) &&
       ((Options::AssignElectrons::HIGHEST_MAGNITUDE_CHARGE == 0 ||
        (bVar13 = (char)*(byte *)((long)pvVar1 + 0x4a) >> 7,
        (byte)((*(byte *)((long)pvVar1 + 0x4a) ^ bVar13) - bVar13) <=
        Options::AssignElectrons::HIGHEST_MAGNITUDE_CHARGE)))) {
      bVar12 = *(char *)((long)pvVar1 + 0x47) + *(char *)((long)pvVar1 + 0x46);
      pvVar5 = *vert;
      bVar13 = 1;
      local_58 = vert;
      for (p_Var7 = *(_Rb_tree_node_base **)((long)pvVar5 + 0x18);
          p_Var7 != (_Rb_tree_node_base *)((long)pvVar5 + 8);
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        lVar2 = *(long *)(p_Var7 + 1);
        dVar8 = std::
                __count_if<__gnu_cxx::__normal_iterator<std::pair<void*,void*>*,std::vector<std::pair<void*,void*>,std::allocator<std::pair<void*,void*>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::pair<void*,void*>const>>
                          ((this->parent_->possibleLocations_).
                           super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (this->parent_->possibleLocations_).
                           super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (pair<void_*,_void_*> *)(lVar2 + 0x30));
        bVar13 = bVar13 & dVar8 == 0;
        bVar12 = bVar12 + *(char *)(lVar2 + 0x46) + *(char *)(lVar2 + 0x47);
      }
      if ((bool)(local_60 == (ElectronOpt *)0x0 & bVar13)) {
        return 0;
      }
      pEVar3 = this->parent_;
      if (*(ulong *)((long)*local_58 + 0x28) < 3) {
        bVar13 = *(byte *)((long)pvVar1 + 0x48);
      }
      else {
        bVar13 = *(byte *)((long)pvVar1 + 0x49);
      }
      if (bVar12 <= bVar13) {
        bVar13 = *(byte *)((long)pvVar1 + 0x4a);
        uVar11 = (uint)CONCAT11((bVar13 ^ (char)bVar13 >> 7) - ((char)bVar13 >> 7),
                                *(undefined1 *)((long)pvVar1 + 0x45));
        uVar4 = uVar11 ^ 0x8000;
        if (-1 < (char)bVar13) {
          uVar4 = uVar11;
        }
        __k = &local_64;
LAB_0011b85c:
        *__k = uVar4;
        _Var9._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find(&(pEVar3->scores_)._M_h,__k);
        if (_Var9._M_cur != (__node_type *)0x0) goto LAB_0011b880;
      }
    }
  }
  else {
    if ((local_60 == (ElectronOpt *)0x0) &&
       (Options::AssignElectrons::USE_CHARGED_BOND_ENERGIES == false)) {
      return 0;
    }
    id_00.second = local_48;
    id_00.first = local_48;
    pvVar5 = ElectronGraph::GetVertex
                       ((this->parent_->elnGraph_).
                        super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,id_00);
    id_01.second = pvStack_40;
    id_01.first = pvStack_40;
    pvVar6 = ElectronGraph::GetVertex
                       ((this->parent_->elnGraph_).
                        super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,id_01);
    bVar13 = *(char *)((long)pvVar5 + 0x47) + *(char *)((long)pvVar5 + 0x46);
    local_60 = this->parent_;
    for (p_Var7 = *(_Rb_tree_node_base **)((long)pvVar5 + 0x18);
        p_Var7 != (_Rb_tree_node_base *)((long)pvVar5 + 8);
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      bVar13 = bVar13 + *(char *)(*(long *)(p_Var7 + 1) + 0x46) +
               *(char *)(*(long *)(p_Var7 + 1) + 0x47);
    }
    if (*(ulong *)((long)pvVar5 + 0x28) < 3) {
      bVar12 = *(byte *)((long)pvVar5 + 0x48);
    }
    else {
      bVar12 = *(byte *)((long)pvVar5 + 0x49);
    }
    if (bVar13 <= bVar12) {
      bVar13 = *(char *)((long)pvVar6 + 0x47) + *(char *)((long)pvVar6 + 0x46);
      for (p_Var7 = *(_Rb_tree_node_base **)((long)pvVar6 + 0x18);
          p_Var7 != (_Rb_tree_node_base *)((long)pvVar6 + 8);
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        bVar13 = bVar13 + *(char *)(*(long *)(p_Var7 + 1) + 0x46) +
                 *(char *)(*(long *)(p_Var7 + 1) + 0x47);
      }
      if (*(ulong *)((long)pvVar6 + 0x28) < 3) {
        bVar12 = *(byte *)((long)pvVar6 + 0x48);
      }
      else {
        bVar12 = *(byte *)((long)pvVar6 + 0x49);
      }
      if (bVar13 <= bVar12) {
        local_64 = (uint)CONCAT11(*(undefined1 *)((long)pvVar6 + 0x45),
                                  *(undefined1 *)((long)pvVar5 + 0x45));
        if (Options::AssignElectrons::USE_CHARGED_BOND_ENERGIES == true) {
          uVar4 = local_64 + 0x10000;
          if (*(char *)((long)pvVar5 + 0x4a) == '\0') {
            uVar4 = local_64;
          }
          if (*(char *)((long)pvVar5 + 0x4a) < '\0') {
            uVar4 = local_64 + 0x20000;
          }
          if (*(char *)((long)pvVar6 + 0x4a) < '\0') {
            local_64 = uVar4 | 0x80000;
          }
          else {
            local_64 = uVar4 + 0x40000;
            if (*(char *)((long)pvVar6 + 0x4a) == '\0') {
              local_64 = uVar4;
            }
          }
        }
        local_64 = ((uint)*(byte *)((long)pvVar1 + 0x47) + (uint)*(byte *)((long)pvVar1 + 0x46)) *
                   0x100000 | local_64;
        _Var9._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find(&(local_60->scores_)._M_h,&local_64);
        if (_Var9._M_cur == (__node_type *)0x0) {
          pEVar3 = this->parent_;
          uVar4 = this->eneBitmask_ & local_64;
          __k = &local_4c;
          goto LAB_0011b85c;
        }
LAB_0011b880:
        pSVar10 = (Score *)((long)&((_Var9._M_cur)->
                                   super__Hash_node_value<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_unsigned_int,_unsigned_int>_>
                                   ._M_storage._M_storage + 4);
        goto LAB_0011b86f;
      }
    }
  }
  pSVar10 = &Options::AssignElectrons::INF;
LAB_0011b86f:
  return *pSVar10;
}

Assistant:

Score ElectronOptimisationAlgorithm::CalculateVertexEnergy(ElnVertex& vert) {
  ElnVertProp* prop = parent_->elnGraph_->GetProperties(vert);
  MolVertPair id = prop->id;
  size_t idCount = std::count(parent_->possibleLocations_.begin(),
                              parent_->possibleLocations_.end(), id);
  
  if (id.first == id.second) { // Atom energies
    if (!opt_::ALLOW_CHARGED_CARBON && prop->atomic_number == 6
        && prop->formal_charge != 0) {
      return opt_::INF;
    }
    if (opt_::HIGHEST_MAGNITUDE_CHARGE > 0
        && (size_t)abs(prop->formal_charge) > opt_::HIGHEST_MAGNITUDE_CHARGE) {
      return opt_::INF;
    }
    uint8_t valence = prop->electron_count + prop->pre_placed;
    bool allZero = true;
    ElnNbrsIterPair nbrs = parent_->elnGraph_->GetNeighbours(vert);
    for (ElnNeighboursIter n = nbrs.first; n != nbrs.second; ++n) {
      ElnVertProp* p = parent_->elnGraph_->GetProperties(*n);
      if (std::count(parent_->possibleLocations_.begin(),
                     parent_->possibleLocations_.end(), p->id) != 0) allZero = false;
      valence += p->electron_count + p->pre_placed;
    }
    
    if (idCount == 0 && allZero) return 0;
    
    if ((parent_->elnGraph_->Degree(vert) > 2
         && valence > prop->target_hyper_octet)
        || (parent_->elnGraph_->Degree(vert) <= 2
            && valence > prop->target_octet)){
      return opt_::INF;
    }
    
    
    uint16_t k = prop->atomic_number + (abs(prop->formal_charge) << 8);
    if (prop->formal_charge < 0)
      k += (1 << 15);
    auto pos = parent_->scores_.find(k);
    if (pos == parent_->scores_.end())
      return opt_::INF;
    else
      return pos->second;
    
  } else { // Bond energies
    if (!opt_::USE_CHARGED_BOND_ENERGIES && idCount == 0) return 0;
    ElnVertex u = parent_->elnGraph_->GetVertex(std::make_pair(id.first, id.first));
    ElnVertex v = parent_->elnGraph_->GetVertex(std::make_pair(id.second, id.second));
    ElnVertProp* u_prop = parent_->elnGraph_->GetProperties(u);
    ElnVertProp* v_prop = parent_->elnGraph_->GetProperties(v);
    
    // check valence state of both atoms
    uint8_t valence_u = u_prop->electron_count + u_prop->pre_placed;
    ElnNbrsIterPair nbrs_u = parent_->elnGraph_->GetNeighbours(u);
    for (; nbrs_u.first != nbrs_u.second; ++nbrs_u.first) {
      ElnVertProp* tmpP = parent_->elnGraph_->GetProperties(*nbrs_u.first);
      valence_u += tmpP->electron_count + tmpP->pre_placed;
    }
    if ((parent_->elnGraph_->Degree(u) > 2
         && valence_u > u_prop->target_hyper_octet)
        || (parent_->elnGraph_->Degree(u) <= 2
            && valence_u > u_prop->target_octet)) {
      return opt_::INF;
    }
    
    uint8_t valence_v = v_prop->electron_count + v_prop->pre_placed;
    ElnNbrsIterPair nbrs_v = parent_->elnGraph_->GetNeighbours(v);
    for (; nbrs_v.first != nbrs_v.second; ++nbrs_v.first) {
      ElnVertProp* tmpP = parent_->elnGraph_->GetProperties(*nbrs_v.first);
      valence_v += tmpP->electron_count + tmpP->pre_placed;
    }
    if ((parent_->elnGraph_->Degree(v) > 2
         && valence_v > v_prop->target_hyper_octet)
        || (parent_->elnGraph_->Degree(v) <= 2
            && valence_v > v_prop->target_octet)) {
      return opt_::INF;
    }
    
    uint32_t k = 0;
    k += u_prop->atomic_number;
    k += (v_prop->atomic_number << 8);
    if (opt_::USE_CHARGED_BOND_ENERGIES){
      if (u_prop->formal_charge < 0)
        k += (2 << 16);
      else if (u_prop->formal_charge > 0)
        k += (1 << 16);
      if (v_prop->formal_charge < 0)
        k += (2 << 18);
      else if (v_prop->formal_charge > 0)
        k += (1 << 18);
    }
    k += ((prop->electron_count + prop->pre_placed) << 20);
    
    auto pos = parent_->scores_.find(k);
    
    if (pos != parent_->scores_.end())
      return pos->second;
    
    pos = parent_->scores_.find(k & eneBitmask_);
    if (pos != parent_->scores_.end())
      return pos->second;
    else
      return opt_::INF;
  }
}